

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

Data processArray(fy_node *node)

{
  Array x;
  fy_node *node_00;
  Data pvVar1;
  void *iter;
  void *local_20;
  
  x = newArray();
  local_20 = (void *)0x0;
  while( true ) {
    node_00 = fy_node_sequence_iterate(node,&local_20);
    if (node_00 == (fy_node *)0x0) {
      pvVar1 = newDataArray(x);
      return pvVar1;
    }
    pvVar1 = parseYaml(node_00);
    if (pvVar1 == (Data)0x0) break;
    putArray(x,pvVar1);
  }
  freeArray(x);
  return (Data)0x0;
}

Assistant:

Data processArray(struct fy_node *node) {
    Array a = newArray();
    //struct fy_node *fy_node_sequence_iterate(struct fy_node *fyn, void **prevp)
    struct fy_node *seqNode;
    void *iter = NULL;
    while ((seqNode = fy_node_sequence_iterate(node, &iter))) {
        Data to_append = parseYaml(seqNode);
        if (to_append == NULL) {
            freeArray(a);
            return NULL;
        }
        putArray(a, to_append);
    }
    return newDataArray(a);
}